

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_6::TwoLevelIterator::SetDataIterator
          (TwoLevelIterator *this,Iterator *data_iter)

{
  long in_FS_OFFSET;
  Status local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->data_iter_).iter_ != (Iterator *)0x0) {
    IteratorWrapper::status((IteratorWrapper *)&local_28);
    if (((this->status_).state_ == (char *)0x0) && ((Iterator *)local_28.state_ != (Iterator *)0x0))
    {
      Status::operator=(&this->status_,&local_28);
    }
    Status::~Status(&local_28);
  }
  IteratorWrapper::Set(&this->data_iter_,data_iter);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TwoLevelIterator::SetDataIterator(Iterator* data_iter) {
  if (data_iter_.iter() != nullptr) SaveError(data_iter_.status());
  data_iter_.Set(data_iter);
}